

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int Symbol_insert(symbol *data,char *key)

{
  s_x2 *psVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  s_x2node *psVar5;
  char *pcVar6;
  symbol *psVar7;
  symbol *psVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  s_x2node *__ptr;
  char *pcVar12;
  symbol *psVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  s_x2node *__s;
  
  psVar1 = x2a;
  if (x2a == (s_x2 *)0x0) {
LAB_0010b773:
    iVar4 = 0;
  }
  else {
    cVar2 = *key;
    if (cVar2 == '\0') {
      uVar10 = 0;
    }
    else {
      pcVar6 = key + 1;
      uVar10 = 0;
      do {
        uVar10 = (int)cVar2 + uVar10 * 0xd;
        cVar2 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while (cVar2 != '\0');
    }
    iVar4 = x2a->size;
    lVar14 = (long)iVar4;
    uVar16 = (long)(int)uVar10 & lVar14 - 1U;
    __s = (s_x2node *)x2a->ht;
    for (psVar8 = (&__s->data)[uVar16]; psVar8 != (symbol *)0x0; psVar8 = (symbol *)psVar8->rule) {
      iVar3 = strcmp(*(char **)&psVar8->index,key);
      if (iVar3 == 0) goto LAB_0010b773;
    }
    iVar3 = psVar1->count;
    lVar9 = (long)iVar3;
    if (iVar3 < iVar4) {
      psVar5 = psVar1->tbl;
    }
    else {
      psVar5 = (s_x2node *)malloc(lVar14 * 0x50);
      if (psVar5 == (s_x2node *)0x0) goto LAB_0010b773;
      __s = psVar5 + lVar14 * 2;
      iVar15 = (int)(lVar14 * 2);
      if (0 < iVar4) {
        memset(__s,0,(lVar14 * 2 & 0xffffffffU) << 3);
      }
      if (iVar3 < 1) {
        __ptr = psVar1->tbl;
      }
      else {
        __ptr = psVar1->tbl;
        lVar14 = 0;
        do {
          pcVar6 = __ptr[lVar14].key;
          cVar2 = *pcVar6;
          uVar11 = 0;
          if (cVar2 != '\0') {
            uVar11 = 0;
            pcVar12 = pcVar6;
            do {
              pcVar12 = pcVar12 + 1;
              uVar11 = (int)cVar2 + uVar11 * 0xd;
              cVar2 = *pcVar12;
            } while (cVar2 != '\0');
          }
          psVar8 = (symbol *)(psVar5 + lVar14);
          psVar7 = (symbol *)(&__s->data + (int)(uVar11 & iVar15 - 1U));
          if ((symbol *)psVar7->name == (symbol *)0x0) {
            psVar13 = (symbol *)0x0;
          }
          else {
            ((symbol *)psVar7->name)->fallback = (symbol *)&psVar8->rule;
            psVar13 = (symbol *)psVar7->name;
          }
          psVar8->rule = (rule *)psVar13;
          *(char **)&psVar8->index = pcVar6;
          psVar8->name = (char *)__ptr[lVar14].data;
          psVar8->fallback = psVar7;
          psVar7->name = (char *)psVar8;
          lVar14 = lVar14 + 1;
        } while (lVar14 != lVar9);
      }
      free(__ptr);
      psVar1->size = iVar15;
      psVar1->tbl = psVar5;
      psVar1->ht = (s_x2node **)__s;
      uVar16 = (ulong)(int)(iVar15 - 1U & uVar10);
    }
    psVar1->count = iVar3 + 1;
    psVar8 = (symbol *)(psVar5 + lVar9);
    psVar5[lVar9].key = key;
    psVar5[lVar9].data = data;
    if ((&__s->data)[uVar16] == (symbol *)0x0) {
      psVar7 = (symbol *)0x0;
    }
    else {
      (&__s->data)[uVar16]->fallback = (symbol *)&psVar8->rule;
      psVar7 = (&__s->data)[uVar16];
    }
    psVar8->rule = (rule *)psVar7;
    (&__s->data)[uVar16] = psVar8;
    psVar8->fallback = (symbol *)(psVar1->ht + uVar16);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Symbol_insert(struct symbol *data, const char *key)
{
  x2node *np;
  int h;
  int ph;

  if( x2a==0 ) return 0;
  ph = strhash(key);
  h = ph & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x2a->count>=x2a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x2 array;
    array.size = size = x2a->size*2;
    array.count = x2a->count;
    array.tbl = (x2node*)malloc(
      (sizeof(x2node) + sizeof(x2node*))*size );
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x2node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x2a->count; i++){
      x2node *oldnp, *newnp;
      oldnp = &(x2a->tbl[i]);
      h = strhash(oldnp->key) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x2a->tbl);
    *x2a = array;
  }
  /* Insert the new data */
  h = ph & (x2a->size-1);
  np = &(x2a->tbl[x2a->count++]);
  np->key = key;
  np->data = data;
  if( x2a->ht[h] ) x2a->ht[h]->from = &(np->next);
  np->next = x2a->ht[h];
  x2a->ht[h] = np;
  np->from = &(x2a->ht[h]);
  return 1;
}